

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangemap.hh
# Opt level: O2

pair<rangemap<ScopeMapper>::PartIterator,_rangemap<ScopeMapper>::PartIterator> __thiscall
rangemap<ScopeMapper>::find(rangemap<ScopeMapper> *this,linetype *point)

{
  bool bVar1;
  const_iterator cVar2;
  pair<rangemap<ScopeMapper>::PartIterator,_rangemap<ScopeMapper>::PartIterator> pVar3;
  key_type local_b8;
  key_type local_68;
  
  local_68.last.base = point->base;
  local_68.last.offset = point->offset;
  local_68.first.base = (AddrSpace *)0x0;
  local_68.a.base = (AddrSpace *)0x0;
  local_68.b.base = (AddrSpace *)0x0;
  local_68.value._M_node = (_List_node_base *)0x0;
  pVar3.first.iter._M_node =
       std::
       _Rb_tree<rangemap<ScopeMapper>::AddrRange,_rangemap<ScopeMapper>::AddrRange,_std::_Identity<rangemap<ScopeMapper>::AddrRange>,_std::less<rangemap<ScopeMapper>::AddrRange>,_std::allocator<rangemap<ScopeMapper>::AddrRange>_>
       ::lower_bound((_Rb_tree<rangemap<ScopeMapper>::AddrRange,_rangemap<ScopeMapper>::AddrRange,_std::_Identity<rangemap<ScopeMapper>::AddrRange>,_std::less<rangemap<ScopeMapper>::AddrRange>,_std::allocator<rangemap<ScopeMapper>::AddrRange>_>
                      *)this,&local_68);
  cVar2 = pVar3.first.iter._M_node;
  if ((_Rb_tree_header *)pVar3.first.iter._M_node !=
      &(this->tree)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = Address::operator<(point,(Address *)(pVar3.first.iter._M_node + 1));
    if (!bVar1) {
      local_b8.last.base = (AddrSpace *)pVar3.first.iter._M_node[1]._M_left;
      local_b8.last.offset = (uintb)pVar3.first.iter._M_node[1]._M_right;
      local_b8.first.base = (AddrSpace *)0x0;
      local_b8.a.base = (AddrSpace *)0x0;
      local_b8.b.base = (AddrSpace *)0x0;
      local_b8.value._M_node = (_List_node_base *)0x0;
      cVar2 = std::
              _Rb_tree<rangemap<ScopeMapper>::AddrRange,_rangemap<ScopeMapper>::AddrRange,_std::_Identity<rangemap<ScopeMapper>::AddrRange>,_std::less<rangemap<ScopeMapper>::AddrRange>,_std::allocator<rangemap<ScopeMapper>::AddrRange>_>
              ::upper_bound((_Rb_tree<rangemap<ScopeMapper>::AddrRange,_rangemap<ScopeMapper>::AddrRange,_std::_Identity<rangemap<ScopeMapper>::AddrRange>,_std::less<rangemap<ScopeMapper>::AddrRange>,_std::allocator<rangemap<ScopeMapper>::AddrRange>_>
                             *)this,&local_b8);
    }
  }
  pVar3.second.iter._M_node = (const_iterator)(const_iterator)cVar2._M_node;
  return pVar3;
}

Assistant:

std::pair<typename rangemap<_recordtype>::const_iterator,typename rangemap<_recordtype>::const_iterator>
rangemap<_recordtype>::find(linetype point) const

{
  AddrRange addrrange(point);
  typename std::multiset<AddrRange>::const_iterator iter1,iter2;

  iter1 = tree.lower_bound(addrrange);
  // Check for no intersection
  if ((iter1==tree.end())||(point < (*iter1).first))
    return std::pair<PartIterator,PartIterator>(PartIterator(iter1),PartIterator(iter1));

  AddrRange addrend((*iter1).last,subsorttype(true));
  iter2 = tree.upper_bound(addrend);
    
  return std::pair<PartIterator,PartIterator>(PartIterator(iter1),PartIterator(iter2));
}